

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O1

void read_long_string(LexState *ls,SemInfo *seminfo,int sep)

{
  size_t sVar1;
  ZIO *pZVar2;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  TString *pTVar6;
  char *msg;
  
  save(ls,ls->current);
  pZVar2 = ls->z;
  sVar1 = pZVar2->n;
  pZVar2->n = pZVar2->n - 1;
  if (sVar1 == 0) {
    uVar4 = luaZ_fill(pZVar2);
  }
  else {
    pbVar3 = (byte *)pZVar2->p;
    pZVar2->p = (char *)(pbVar3 + 1);
    uVar4 = (uint)*pbVar3;
  }
  ls->current = uVar4;
  if ((uVar4 == 0xd) || (uVar4 == 10)) {
    inclinenumber(ls);
  }
  msg = "unfinished long string";
  if (seminfo == (SemInfo *)0x0) {
    msg = "unfinished long comment";
  }
  do {
    while( true ) {
      while (iVar5 = ls->current, 0xc < iVar5) {
        if (iVar5 == 0xd) goto LAB_0010b2c0;
        if (iVar5 == 0x5b) {
          iVar5 = skip_sep(ls);
          if (iVar5 == sep) {
            save(ls,ls->current);
            pZVar2 = ls->z;
            sVar1 = pZVar2->n;
            pZVar2->n = pZVar2->n - 1;
            if (sVar1 == 0) {
              uVar4 = luaZ_fill(pZVar2);
            }
            else {
              pbVar3 = (byte *)pZVar2->p;
              pZVar2->p = (char *)(pbVar3 + 1);
              uVar4 = (uint)*pbVar3;
            }
            ls->current = uVar4;
            if (sep == 0) {
              luaX_lexerror(ls,"nesting of [[...]] is deprecated",0x5b);
            }
          }
        }
        else {
          if (iVar5 != 0x5d) goto LAB_0010b326;
          iVar5 = skip_sep(ls);
          if (iVar5 == sep) {
            save(ls,ls->current);
            pZVar2 = ls->z;
            sVar1 = pZVar2->n;
            pZVar2->n = pZVar2->n - 1;
            if (sVar1 == 0) {
              uVar4 = luaZ_fill(pZVar2);
            }
            else {
              pbVar3 = (byte *)pZVar2->p;
              pZVar2->p = (char *)(pbVar3 + 1);
              uVar4 = (uint)*pbVar3;
            }
            ls->current = uVar4;
            if (seminfo != (SemInfo *)0x0) {
              pTVar6 = luaX_newstring(ls,ls->buff->buffer + (ulong)(uint)sep + 2,
                                      ls->buff->n - (ulong)(sep * 2 + 4));
              seminfo->ts = pTVar6;
            }
            return;
          }
        }
      }
      if (iVar5 == -1) break;
      if (iVar5 == 10) {
LAB_0010b2c0:
        save(ls,10);
        inclinenumber(ls);
        if (seminfo == (SemInfo *)0x0) {
          ls->buff->n = 0;
        }
      }
      else {
LAB_0010b326:
        if (seminfo != (SemInfo *)0x0) {
          save(ls,iVar5);
        }
        pZVar2 = ls->z;
        sVar1 = pZVar2->n;
        pZVar2->n = pZVar2->n - 1;
        if (sVar1 == 0) {
          uVar4 = luaZ_fill(pZVar2);
        }
        else {
          pbVar3 = (byte *)pZVar2->p;
          pZVar2->p = (char *)(pbVar3 + 1);
          uVar4 = (uint)*pbVar3;
        }
        ls->current = uVar4;
      }
    }
    luaX_lexerror(ls,msg,0x11f);
  } while( true );
}

Assistant:

static void read_long_string (LexState *ls, SemInfo *seminfo, int sep) {
  int cont = 0;
  (void)(cont);  /* avoid warnings when `cont' is not used */
  save_and_next(ls);  /* skip 2nd `[' */
  if (currIsNewline(ls))  /* string starts with a newline? */
    inclinenumber(ls);  /* skip it */
  for (;;) {
    switch (ls->current) {
      case EOZ:
        luaX_lexerror(ls, (seminfo) ? "unfinished long string" :
                                   "unfinished long comment", TK_EOS);
        break;  /* to avoid warnings */
#if defined(LUA_COMPAT_LSTR)
      case '[': {
        if (skip_sep(ls) == sep) {
          save_and_next(ls);  /* skip 2nd `[' */
          cont++;
#if LUA_COMPAT_LSTR == 1
          if (sep == 0)
            luaX_lexerror(ls, "nesting of [[...]] is deprecated", '[');
#endif
        }
        break;
      }
#endif
      case ']': {
        if (skip_sep(ls) == sep) {
          save_and_next(ls);  /* skip 2nd `]' */
#if defined(LUA_COMPAT_LSTR) && LUA_COMPAT_LSTR == 2
          cont--;
          if (sep == 0 && cont >= 0) break;
#endif
          goto endloop;
        }
        break;
      }
      case '\n':
      case '\r': {
        save(ls, '\n');
        inclinenumber(ls);
        if (!seminfo) luaZ_resetbuffer(ls->buff);  /* avoid wasting space */
        break;
      }
      default: {
        if (seminfo) save_and_next(ls);
        else next(ls);
      }
    }
  } endloop:
  if (seminfo)
    seminfo->ts = luaX_newstring(ls, luaZ_buffer(ls->buff) + (2 + sep),
                                     luaZ_bufflen(ls->buff) - 2*(2 + sep));
}